

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_wait(CURLM *multi_handle,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pollfd *ufds;
  ulong uVar5;
  ulong uVar6;
  ulong extraout_RDX;
  ulong uVar7;
  ulong extraout_RDX_00;
  int iVar8;
  SessionHandle *pSVar9;
  uint timeout_ms_00;
  CURLMcode CVar10;
  ushort uVar11;
  int iVar12;
  bool bVar13;
  curl_socket_t sockbunch [5];
  long timeout_internal;
  uint local_58 [6];
  int *local_40;
  long local_38;
  
  uVar6 = (ulong)extra_nfds;
  CVar10 = CURLM_BAD_HANDLE;
  if ((multi_handle != (CURLM *)0x0) && (*multi_handle == 0xbab1e)) {
    local_40 = ret;
    multi_timeout((Curl_multi *)multi_handle,&local_38);
    timeout_ms_00 = timeout_ms;
    if (local_38 < timeout_ms) {
      timeout_ms_00 = (uint)local_38;
    }
    if (local_38 < 0) {
      timeout_ms_00 = timeout_ms;
    }
    pSVar9 = *(SessionHandle **)((long)multi_handle + 8);
    iVar12 = 0;
    if (pSVar9 != (SessionHandle *)0x0) {
      uVar7 = extraout_RDX;
      iVar12 = 0;
      do {
        uVar2 = multi_getsock(pSVar9,(curl_socket_t *)local_58,(int)uVar7);
        uVar5 = 0;
        do {
          if ((uVar2 >> ((uint)uVar5 & 0x1f) & 1) == 0) {
            uVar7 = 0xffffffff;
          }
          else {
            iVar12 = iVar12 + 1;
            uVar7 = (ulong)local_58[uVar5];
          }
          if (((uVar2 >> ((byte)uVar5 & 0x1f)) >> 0x10 & 1) != 0) {
            iVar12 = iVar12 + 1;
            uVar7 = (ulong)local_58[uVar5];
          }
        } while (((int)uVar7 != -1) &&
                (uVar7 = uVar5 + 1, bVar13 = uVar5 < 4, uVar5 = uVar7, bVar13));
        pSVar9 = pSVar9->next;
      } while (pSVar9 != (SessionHandle *)0x0);
    }
    uVar2 = 0;
    if (iVar12 + extra_nfds == 0 && extra_nfds == 0) {
      ufds = (pollfd *)0x0;
    }
    else {
      ufds = (pollfd *)(*Curl_cmalloc)((ulong)(iVar12 + extra_nfds) << 3);
      uVar6 = extraout_RDX_00;
      if (ufds == (pollfd *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    if ((iVar12 != 0) &&
       (pSVar9 = *(SessionHandle **)((long)multi_handle + 8), pSVar9 != (SessionHandle *)0x0)) {
      uVar7 = 0;
      do {
        uVar3 = multi_getsock(pSVar9,(curl_socket_t *)local_58,(int)uVar6);
        uVar5 = 0;
        do {
          if ((uVar3 >> ((uint)uVar5 & 0x1f) & 1) == 0) {
            uVar6 = 0xffffffff;
          }
          else {
            ufds[uVar7].fd = local_58[uVar5];
            ufds[uVar7].events = 1;
            uVar7 = (ulong)((int)uVar7 + 1);
            uVar6 = (ulong)local_58[uVar5];
          }
          if (((uVar3 >> ((byte)uVar5 & 0x1f)) >> 0x10 & 1) != 0) {
            ufds[uVar7].fd = local_58[uVar5];
            ufds[uVar7].events = 4;
            uVar7 = (ulong)((int)uVar7 + 1);
            uVar6 = (ulong)local_58[uVar5];
          }
          uVar2 = (uint)uVar7;
        } while (((int)uVar6 != -1) &&
                (uVar6 = uVar5 + 1, bVar13 = uVar5 < 4, uVar5 = uVar6, bVar13));
        pSVar9 = pSVar9->next;
      } while (pSVar9 != (SessionHandle *)0x0);
    }
    if (extra_nfds != 0) {
      uVar6 = 0;
      do {
        uVar3 = uVar2 + (int)uVar6;
        ufds[uVar3].fd = extra_fds[uVar6].fd;
        ufds[uVar3].events = 0;
        uVar11 = extra_fds[uVar6].events & 1;
        ufds[uVar3].events = uVar11;
        uVar1 = extra_fds[uVar6].events;
        if ((uVar1 & 2) != 0) {
          ufds[uVar3].events = uVar11 | 2;
        }
        if ((uVar1 & 4) != 0) {
          *(byte *)&ufds[uVar3].events = (byte)ufds[uVar3].events | 4;
        }
        uVar6 = uVar6 + 1;
      } while (extra_nfds != uVar6);
      uVar2 = uVar2 + (int)uVar6;
    }
    iVar8 = 0;
    if (uVar2 != 0) {
      Curl_infof((SessionHandle *)0x0,"Curl_poll(%d ds, %d ms)\n",(ulong)uVar2,(ulong)timeout_ms_00)
      ;
      iVar4 = Curl_poll(ufds,uVar2,timeout_ms_00);
      iVar8 = 0;
      if ((iVar4 != 0) && (iVar8 = iVar4, extra_nfds != 0)) {
        uVar6 = 0;
        do {
          extra_fds[uVar6].revents = ufds[(uint)(iVar12 + (int)uVar6)].revents & 7;
          uVar6 = uVar6 + 1;
        } while (extra_nfds != uVar6);
      }
    }
    (*Curl_cfree)(ufds);
    CVar10 = CURLM_OK;
    if (local_40 != (int *)0x0) {
      *local_40 = iVar8;
      CVar10 = CURLM_OK;
    }
  }
  return CVar10;
}

Assistant:

CURLMcode curl_multi_wait(CURLM *multi_handle,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  long timeout_internal;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  /* Count up how many fds we have from the multi handle */
  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds || extra_nfds) {
    ufds = malloc(nfds * sizeof(struct pollfd));
    if(!ufds)
      return CURLM_OUT_OF_MEMORY;
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data=multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    /* wait... */
    infof(data, "Curl_poll(%d ds, %d ms)\n", nfds, timeout_ms);
    i = Curl_poll(ufds, nfds, timeout_ms);

    if(i) {
      unsigned int j;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(j = 0; j < extra_nfds; j++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + j].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[j].revents = mask;
      }
    }
  }
  else
    i = 0;

  free(ufds);
  if(ret)
    *ret = i;
  return CURLM_OK;
}